

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

bool __thiscall
andres::Iterator<int,false,std::allocator<unsigned_long>>::operator!=
          (Iterator<int,false,std::allocator<unsigned_long>> *this,
          Iterator<int,_false,_std::allocator<unsigned_long>_> *it)

{
  runtime_error *this_00;
  
  if (*(view_pointer *)this == (view_pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (it->view_ == (view_pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    if (it->view_ == *(view_pointer *)this) {
      return *(size_t *)(this + 0x10) != it->index_;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool
Iterator<T, isConst, A>::operator!=
(
    const Iterator<T, isConstLocal, A>& it
) const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || it.view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || 
        static_cast<const void*>(it.view_) == static_cast<const void*>(view_));
    return index_ != it.index_;
}